

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vox2obj.cpp
# Opt level: O1

bool export_scene_anim_as_obj
               (ogt_vox_scene *scene,string *out_name,bool out_file_per_frame,float voxel_scale,
               uint32_t frame_min,uint32_t frame_max,char *mesh_algorithm)

{
  undefined8 *puVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  pointer pcVar6;
  ogt_vox_model *poVar7;
  uint32_t *puVar8;
  byte bVar9;
  uint32_t i;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  FILE *pFVar14;
  undefined8 *puVar15;
  long *plVar16;
  ogt_mesh *poVar17;
  uint8_t *puVar18;
  long *plVar19;
  ogt_mesh_vertex *poVar20;
  undefined7 in_register_00000011;
  ulong uVar21;
  bool bVar22;
  ogt_vox_instance *instance;
  float fVar23;
  undefined8 uVar24;
  uint32_t value;
  ogt_vox_scene *scene_00;
  uint32_t frame_max_local;
  ulong local_848;
  undefined8 *local_840;
  undefined8 local_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined4 local_81c;
  uint local_818;
  uint32_t frame_min_local;
  ulong *local_810;
  long local_808;
  ulong local_800 [2];
  string *local_7f0;
  ogt_vox_scene *local_7e8;
  FILE *local_7e0;
  string local_7d8;
  string out_material_name;
  string out_texture_name;
  vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_> meshes;
  ogt_voxel_meshify_context meshify_context;
  uint8_t auStack_73a [2];
  uint8_t tga_data [768];
  ogt_vox_palette palette;
  
  local_81c = (undefined4)CONCAT71(in_register_00000011,out_file_per_frame);
  frame_max_local = frame_max;
  frame_min_local = frame_min;
  get_frame_min_max(scene,&frame_min_local,&frame_max_local);
  memcpy(&palette,&scene->palette,0x400);
  lVar13 = 0;
  do {
    palette.color[lVar13].a = (uint8_t)lVar13;
    lVar13 = lVar13 + 1;
  } while (lVar13 != 0x100);
  meshify_context.alloc_func = (ogt_voxel_meshify_alloc_func)0x0;
  meshify_context.free_func = (ogt_voxel_meshify_free_func)0x0;
  meshify_context.alloc_free_user_data = (void *)0x0;
  meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  tga_data[0] = '\0';
  tga_data[1] = '\0';
  tga_data[2] = '\0';
  tga_data[3] = '\0';
  tga_data[4] = '\0';
  tga_data[5] = '\0';
  tga_data[6] = '\0';
  tga_data[7] = '\0';
  std::vector<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>::resize
            (&meshes,(ulong)scene->num_models,(value_type *)tga_data);
  out_texture_name._M_dataplus._M_p = (pointer)&out_texture_name.field_2;
  pcVar6 = (out_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&out_texture_name,pcVar6,pcVar6 + out_name->_M_string_length);
  local_7e8 = scene;
  std::__cxx11::string::append((char *)&out_texture_name);
  out_material_name._M_dataplus._M_p = (pointer)&out_material_name.field_2;
  pcVar6 = (out_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&out_material_name,pcVar6,pcVar6 + out_name->_M_string_length);
  std::__cxx11::string::append((char *)&out_material_name);
  pFVar14 = fopen(out_texture_name._M_dataplus._M_p,"wb");
  if (pFVar14 == (FILE *)0x0) {
    printf("could not open file \'%s\' for write - aborting!",out_texture_name._M_dataplus._M_p);
  }
  else {
    printf("writing file %s\n",out_texture_name._M_dataplus._M_p);
    lVar13 = 2;
    puVar18 = &palette.color[0].b;
    do {
      auStack_73a[lVar13] = ((ogt_vox_rgba *)(puVar18 + -2))->r;
      auStack_73a[lVar13 + 1] = puVar18[-1];
      tga_data[lVar13] = *puVar18;
      lVar13 = lVar13 + 3;
      puVar18 = puVar18 + 4;
    } while (lVar13 != 0x302);
    write_tga_24bit(tga_data,0x100,1,(FILE *)pFVar14);
    fclose(pFVar14);
  }
  if (pFVar14 != (FILE *)0x0) {
    pFVar14 = fopen(out_material_name._M_dataplus._M_p,"wb");
    if (pFVar14 != (FILE *)0x0) {
      printf("writing file %s\n",out_material_name._M_dataplus._M_p);
      fwrite("# opengametools vox2animobj - see source code at https://github.com/jpaver/opengametools/tree/master/apps/vox2animobj.cpp\r\n"
             ,0x7b,1,pFVar14);
      fwrite("\r\n",2,1,pFVar14);
      fwrite("newmtl palette\r\n",0x10,1,pFVar14);
      fwrite("illum 1\r\n",9,1,pFVar14);
      fwrite("Ka 0.000 0.000 0.000\r\n",0x16,1,pFVar14);
      fwrite("Kd 1.000 1.000 1.000\r\n",0x16,1,pFVar14);
      fwrite("Ks 0.000 0.000 0.000\r\n",0x16,1,pFVar14);
      fprintf(pFVar14,"map_Kd %s\r\n",out_texture_name._M_dataplus._M_p);
      fclose(pFVar14);
      if (frame_max_local < frame_min_local) {
        bVar22 = true;
        pFVar14 = (FILE *)0x0;
      }
      else {
        bVar9 = 0;
        pFVar14 = (FILE *)0x0;
        iVar12 = 0;
        scene_00 = local_7e8;
        value = frame_min_local;
        local_7f0 = out_name;
        do {
          if ((char)local_81c == '\0') {
            if (pFVar14 == (FILE *)0x0) {
              tga_data._0_8_ = tga_data + 0x10;
              pcVar6 = (local_7f0->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)tga_data,pcVar6,pcVar6 + local_7f0->_M_string_length);
              std::__cxx11::string::append((char *)tga_data);
              pFVar14 = (FILE *)open_obj_file((char *)tga_data._0_8_);
              if (pFVar14 == (FILE *)0x0) {
                printf("could not open file \'%s\' for write - aborting!",tga_data._0_8_);
                bVar9 = 1;
              }
              if ((uint8_t *)tga_data._0_8_ != tga_data + 0x10) {
                operator_delete((void *)tga_data._0_8_);
              }
              goto LAB_0010fed6;
            }
          }
          else {
            if (pFVar14 != (FILE *)0x0) {
              fclose(pFVar14);
            }
            local_810 = local_800;
            pcVar6 = (local_7f0->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_810,pcVar6,pcVar6 + local_7f0->_M_string_length);
            std::__cxx11::string::append((char *)&local_810);
            zero_padded_string_abi_cxx11_(&local_7d8,value,3);
            uVar21 = 0xf;
            if (local_810 != local_800) {
              uVar21 = local_800[0];
            }
            if (uVar21 < local_7d8._M_string_length + local_808) {
              uVar24 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
                uVar24 = local_7d8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar24 < local_7d8._M_string_length + local_808) goto LAB_0010fcd0;
              puVar15 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_7d8,0,(char *)0x0,(ulong)local_810);
            }
            else {
LAB_0010fcd0:
              puVar15 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_810,(ulong)local_7d8._M_dataplus._M_p);
            }
            puVar1 = puVar15 + 2;
            if ((undefined8 *)*puVar15 == puVar1) {
              local_830 = *puVar1;
              uStack_828 = puVar15[3];
              local_840 = &local_830;
            }
            else {
              local_830 = *puVar1;
              local_840 = (undefined8 *)*puVar15;
            }
            local_838 = puVar15[1];
            *puVar15 = puVar1;
            puVar15[1] = 0;
            *(undefined1 *)puVar1 = 0;
            plVar16 = (long *)std::__cxx11::string::append((char *)&local_840);
            plVar19 = plVar16 + 2;
            if ((long *)*plVar16 == plVar19) {
              tga_data._16_8_ = *plVar19;
              tga_data._24_8_ = plVar16[3];
              tga_data._0_8_ = tga_data + 0x10;
            }
            else {
              tga_data._16_8_ = *plVar19;
              tga_data._0_8_ = (long *)*plVar16;
            }
            tga_data._8_8_ = plVar16[1];
            *plVar16 = (long)plVar19;
            plVar16[1] = 0;
            *(undefined1 *)(plVar16 + 2) = 0;
            if (local_840 != &local_830) {
              operator_delete(local_840);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
              operator_delete(local_7d8._M_dataplus._M_p);
            }
            if (local_810 != local_800) {
              operator_delete(local_810);
            }
            pFVar14 = (FILE *)open_obj_file((char *)tga_data._0_8_);
            iVar11 = 0;
            if (pFVar14 == (FILE *)0x0) {
              printf("could not open file \'%s\' for write - aborting!",tga_data._0_8_);
              bVar9 = 1;
              iVar11 = iVar12;
            }
            iVar12 = iVar11;
            if ((uint8_t *)tga_data._0_8_ != tga_data + 0x10) {
              operator_delete((void *)tga_data._0_8_);
            }
LAB_0010fed6:
            if (pFVar14 == (FILE *)0x0) break;
          }
          fprintf(pFVar14,"o frame_%03u\n",(ulong)value);
          fprintf(pFVar14,"mtllib %s\n",out_material_name._M_dataplus._M_p);
          fwrite("usemtl palette\n",0xf,1,pFVar14);
          if (scene_00->num_instances != 0) {
            uVar21 = 0;
            local_818 = value;
            local_7e0 = pFVar14;
            do {
              if (((scene_00->instances[uVar21].hidden == false) &&
                  (instance = scene_00->instances + uVar21,
                  scene_00->layers[instance->layer_index].hidden == false)) &&
                 (((ulong)instance->group_index == 0xffffffff ||
                  (scene_00->groups[instance->group_index].hidden == false)))) {
                local_848 = uVar21;
                ogt_vox_sample_instance_transform_global
                          ((ogt_vox_transform *)tga_data,instance,value,scene_00);
                if ((instance->model_anim).num_keyframes == 0) {
                  uVar10 = instance->model_index;
                }
                else {
                  uVar10 = ogt_vox_sample_anim_model(&instance->model_anim,value);
                }
                poVar7 = scene_00->models[uVar10];
                if ((poVar7 != (ogt_vox_model *)0x0) &&
                   (meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar10] == (ogt_mesh *)0x0)) {
                  printf("  - generating mesh for model of size %u x %u x %u using mesh_algorithm %s\n"
                         ,(ulong)poVar7->size_x,(ulong)poVar7->size_y,(ulong)poVar7->size_z,
                         mesh_algorithm);
                  iVar11 = strcmp(mesh_algorithm,"polygon");
                  if (iVar11 == 0) {
                    poVar17 = ogt_mesh_from_paletted_voxels_polygon
                                        (&meshify_context,poVar7->voxel_data,poVar7->size_x,
                                         poVar7->size_y,poVar7->size_z,(ogt_mesh_rgba *)&palette);
                  }
                  else {
                    iVar11 = strcmp(mesh_algorithm,"greedy");
                    if (iVar11 == 0) {
                      poVar17 = ogt_mesh_from_paletted_voxels_greedy
                                          (&meshify_context,poVar7->voxel_data,poVar7->size_x,
                                           poVar7->size_y,poVar7->size_z,(ogt_mesh_rgba *)&palette);
                    }
                    else {
                      poVar17 = ogt_mesh_from_paletted_voxels_simple
                                          (&meshify_context,poVar7->voxel_data,poVar7->size_x,
                                           poVar7->size_y,poVar7->size_z,(ogt_mesh_rgba *)&palette);
                    }
                  }
                  if (poVar17->vertex_count != 0) {
                    poVar20 = poVar17->vertices;
                    uVar21 = 0;
                    do {
                      (poVar20->pos).x = (poVar20->pos).x - (float)(poVar7->size_x >> 1);
                      (poVar20->pos).y = (poVar20->pos).y - (float)(poVar7->size_y >> 1);
                      (poVar20->pos).z = (poVar20->pos).z - (float)(poVar7->size_z >> 1);
                      fVar23 = (poVar20->normal).x;
                      if ((fVar23 != 0.0) || (NAN(fVar23))) {
                        fVar23 = (float)(uint)(fVar23 <= 0.0);
                      }
                      else {
                        fVar23 = (poVar20->normal).y;
                        if ((fVar23 != 0.0) || (NAN(fVar23))) {
                          fVar23 = (float)(0.0 < fVar23 ^ 3);
                        }
                        else {
                          fVar23 = (float)(0.0 < (poVar20->normal).z ^ 5);
                        }
                      }
                      (poVar20->normal).x = fVar23;
                      uVar21 = uVar21 + 1;
                      poVar20 = poVar20 + 1;
                    } while (uVar21 < poVar17->vertex_count);
                  }
                  meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10] = poVar17;
                }
                poVar17 = meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl
                          .super__Vector_impl_data._M_start[uVar10];
                uVar21 = local_848;
                if (poVar17 != (ogt_mesh *)0x0) {
                  if ((voxel_scale != 1.0) || (NAN(voxel_scale))) {
                    lVar13 = 0;
                    do {
                      *(float *)(tga_data + lVar13 * 4) =
                           *(float *)(tga_data + lVar13 * 4) * voxel_scale;
                      lVar13 = lVar13 + 1;
                    } while (lVar13 != 0x10);
                    if (poVar17->vertex_count != 0) {
                      lVar13 = 8;
                      uVar21 = 0;
                      do {
                        poVar20 = poVar17->vertices;
                        fVar23 = *(float *)((long)poVar20 + lVar13 + -8);
                        fVar2 = *(float *)((long)poVar20 + lVar13 + -4);
                        fVar3 = *(float *)((long)&(poVar20->pos).x + lVar13);
                        fprintf(pFVar14,"v %f %f %f\n",
                                SUB84((double)((float)tga_data._32_4_ * fVar3 +
                                               (float)tga_data._0_4_ * fVar23 +
                                               (float)tga_data._16_4_ * fVar2 +
                                              (float)tga_data._48_4_),0),
                                (double)((float)tga_data._36_4_ * fVar3 +
                                         (float)tga_data._4_4_ * fVar23 +
                                         (float)tga_data._20_4_ * fVar2 + (float)tga_data._52_4_),
                                (double)(fVar3 * (float)tga_data._40_4_ +
                                         fVar23 * (float)tga_data._8_4_ +
                                         fVar2 * (float)tga_data._24_4_ + (float)tga_data._56_4_));
                        uVar21 = uVar21 + 1;
                        lVar13 = lVar13 + 0x20;
                      } while (uVar21 < poVar17->vertex_count);
                    }
                  }
                  else if (poVar17->vertex_count != 0) {
                    lVar13 = 8;
                    uVar21 = 0;
                    do {
                      poVar20 = poVar17->vertices;
                      fVar23 = *(float *)((long)poVar20 + lVar13 + -8);
                      fVar2 = *(float *)((long)poVar20 + lVar13 + -4);
                      fVar3 = *(float *)((long)&(poVar20->pos).x + lVar13);
                      fprintf(pFVar14,"v %i %i %i\n",
                              (ulong)(uint)(int)((float)tga_data._32_4_ * fVar3 +
                                                 (float)tga_data._0_4_ * fVar23 +
                                                 (float)tga_data._16_4_ * fVar2 +
                                                (float)tga_data._48_4_),
                              (ulong)(uint)(int)((float)tga_data._36_4_ * fVar3 +
                                                 (float)tga_data._4_4_ * fVar23 +
                                                 (float)tga_data._20_4_ * fVar2 +
                                                (float)tga_data._52_4_),
                              (ulong)(uint)(int)(fVar3 * (float)tga_data._40_4_ +
                                                 fVar23 * (float)tga_data._8_4_ +
                                                 fVar2 * (float)tga_data._24_4_ +
                                                (float)tga_data._56_4_));
                      uVar21 = uVar21 + 1;
                      lVar13 = lVar13 + 0x20;
                    } while (uVar21 < poVar17->vertex_count);
                  }
                  if (poVar17->index_count != 0) {
                    iVar11 = iVar12 + 1;
                    uVar21 = 0;
                    do {
                      poVar20 = poVar17->vertices;
                      puVar8 = poVar17->indices;
                      uVar10 = puVar8[uVar21];
                      uVar4 = puVar8[uVar21 + 1];
                      uVar5 = puVar8[uVar21 + 2];
                      fprintf(local_7e0,"f %u/%u/%u %u/%u/%u %u/%u/%u\n",(ulong)(uVar10 + iVar11),
                              (ulong)(poVar20[uVar10].color.a + 1),
                              (ulong)((int)poVar20[uVar10].normal.x + 1),(ulong)(uVar4 + iVar11),
                              (ulong)(poVar20[uVar4].color.a + 1),
                              (ulong)((int)poVar20[uVar4].normal.x + 1),(ulong)(uVar5 + iVar11),
                              (ulong)(poVar20[uVar5].color.a + 1),
                              (ulong)((int)poVar20[uVar5].normal.x + 1));
                      uVar21 = uVar21 + 3;
                    } while (uVar21 < poVar17->index_count);
                  }
                  iVar12 = iVar12 + poVar17->vertex_count;
                  uVar21 = local_848;
                  scene_00 = local_7e8;
                  pFVar14 = local_7e0;
                  value = local_818;
                }
              }
              uVar21 = uVar21 + 1;
            } while (uVar21 < scene_00->num_instances);
          }
          value = value + 1;
        } while (value <= frame_max_local);
        bVar22 = (bool)(bVar9 ^ 1);
      }
      if (pFVar14 != (FILE *)0x0) {
        fclose(pFVar14);
      }
      goto LAB_001104f6;
    }
    printf("could not open file \'%s\' for write - aborting!",out_material_name._M_dataplus._M_p);
  }
  bVar22 = false;
LAB_001104f6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out_material_name._M_dataplus._M_p != &out_material_name.field_2) {
    operator_delete(out_material_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)out_texture_name._M_dataplus._M_p != &out_texture_name.field_2) {
    operator_delete(out_texture_name._M_dataplus._M_p);
  }
  if (meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(meshes.super__Vector_base<ogt_mesh_*,_std::allocator<ogt_mesh_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar22;
}

Assistant:

bool export_scene_anim_as_obj(const ogt_vox_scene* scene, const std::string& out_name, bool out_file_per_frame, float voxel_scale, uint32_t frame_min, uint32_t frame_max, const char* mesh_algorithm) {
    get_frame_min_max(scene, frame_min, frame_max);

    // put the color index into the alpha component of every color in the palette
    ogt_vox_palette palette = scene->palette;
    for (uint32_t i = 0; i < 256; i++) {
        palette.color[i].a = (uint8_t)i;
    }

    // meshify all models.
    ogt_voxel_meshify_context meshify_context = {};
    std::vector<ogt_mesh*> meshes;
    meshes.resize(scene->num_models, nullptr);

    // go through all frames
    std::string out_texture_name = out_name + ".tga";
    std::string out_material_name = out_name + ".mtl";

    // write palette data as tga
    {
        FILE* fout = open_file(out_texture_name.c_str(), "wb");
        if (!fout) {
            printf("could not open file '%s' for write - aborting!", out_texture_name.c_str());
            return false;
        }

        printf("writing file %s\n", out_texture_name.c_str());
        uint8_t tga_data[256*3];
        for (uint32_t j = 0; j < 256; j++) {
            tga_data[j * 3 + 0] = palette.color[j].r;
            tga_data[j * 3 + 1] = palette.color[j].g;
            tga_data[j * 3 + 2] = palette.color[j].b;
        }
        write_tga_24bit(tga_data, 256, 1, fout);
        fclose(fout);
    }

    // write material data
    {
        FILE* fout = open_file(out_material_name.c_str(), "wb");
        if (!fout) {
            printf("could not open file '%s' for write - aborting!", out_material_name.c_str());
            return false;
        }
        printf("writing file %s\n", out_material_name.c_str());
        fprintf(fout, "# opengametools vox2animobj - see source code at https://github.com/jpaver/opengametools/tree/master/apps/vox2animobj.cpp\r\n"); // TODO(jpaver) proper header
        fprintf(fout, "\r\n");
        fprintf(fout, "newmtl palette\r\n");
        fprintf(fout, "illum 1\r\n");
        fprintf(fout, "Ka 0.000 0.000 0.000\r\n");
        fprintf(fout, "Kd 1.000 1.000 1.000\r\n");
        fprintf(fout, "Ks 0.000 0.000 0.000\r\n");
        fprintf(fout, "map_Kd %s\r\n", out_texture_name.c_str());
        fclose(fout);
    }

    // write geometry data
    bool error = false;
    {
        FILE* fout = nullptr;
        uint32_t base_vertex_index = 0;
        for (uint32_t frame_index = frame_min; frame_index <= frame_max; frame_index++) {
            if (out_file_per_frame) {
                if (fout)
                    fclose(fout);
                std::string out_obj_name = out_name + "-" + zero_padded_string(frame_index, 3) + ".obj";
                fout = open_obj_file(out_obj_name.c_str());
                if (!fout) {
                    printf("could not open file '%s' for write - aborting!", out_obj_name.c_str());
                    error = true;
                    break;
                }
                base_vertex_index = 0;
            }
            else if (!fout) {
                std::string out_obj_name = out_name + ".obj";
                fout = open_obj_file(out_obj_name.c_str());
                if (!fout) {
                    printf("could not open file '%s' for write - aborting!", out_obj_name.c_str());
                    error = true;
                    break;
                }
            }

            fprintf(fout, "o frame_%03u\n", frame_index);
            fprintf(fout, "mtllib %s\n", out_material_name.c_str());
            fprintf(fout, "usemtl palette\n");

            for (uint32_t instance_index = 0; instance_index < scene->num_instances; instance_index++) {
                const ogt_vox_instance* instance = &scene->instances[instance_index];
                // skip this instance if it's hidden in the .vox file
                if (instance->hidden)
                    continue;
                // skip this instance if it's part of a hidden layer in the .vox file
                if (scene->layers[instance->layer_index].hidden)
                    continue;
                // skip this instance if it's part of a hidden group
                if (instance->group_index != k_invalid_group_index && scene->groups[instance->group_index].hidden)
                    continue;

                ogt_vox_transform transform   = ogt_vox_sample_instance_transform_global(instance, frame_index, scene);
                uint32_t          model_index = ogt_vox_sample_instance_model(instance, frame_index);

                // just in time generate the mesh for this model if we haven't already done so.
                const ogt_vox_model* model = scene->models[model_index];
                if (model && !meshes[model_index]) {
                    // generate a mesh for this model using the mesh_algorithm specified
                    printf("  - generating mesh for model of size %u x %u x %u using mesh_algorithm %s\n", model->size_x, model->size_y, model->size_z, mesh_algorithm);
                    ogt_mesh* mesh =
                        (strcmp(mesh_algorithm, "polygon") == 0) ? ogt_mesh_from_paletted_voxels_polygon(&meshify_context, model->voxel_data, model->size_x, model->size_y, model->size_z, (const ogt_mesh_rgba*)&palette.color[0]) :
                        (strcmp(mesh_algorithm, "greedy") == 0) ? ogt_mesh_from_paletted_voxels_greedy(&meshify_context, model->voxel_data, model->size_x, model->size_y, model->size_z, (const ogt_mesh_rgba*)&palette.color[0]) :
                        (strcmp(mesh_algorithm, "simple") == 0) ? ogt_mesh_from_paletted_voxels_simple(&meshify_context, model->voxel_data, model->size_x, model->size_y, model->size_z, (const ogt_mesh_rgba*)&palette.color[0]) :
                        NULL;

                    for (uint32_t i = 0; i < mesh->vertex_count; i++) {
                        // pre-bias the mesh vertices by the model dimensions - resets the center/pivot so it is at (0,0,0)
                        mesh->vertices[i].pos.x -= (float)(model->size_x / 2);
                        mesh->vertices[i].pos.y -= (float)(model->size_y / 2);
                        mesh->vertices[i].pos.z -= (float)(model->size_z / 2);
                        // the normal is always a unit vector aligned on one of the 6 cardinal directions, here we just
                        // precompute which index it was (same order as the 'vn' tags we wrote out when opening the file)
                        // and write it as a uint32_t into the x field. This allows us to avoid do this index conversion
                        // for every vert in a mesh, and not for every vert multiplied by the number of instances.
                        ogt_mesh_vec3& normal = mesh->vertices[i].normal;
                        uint32_t normal_index = normal.x != 0 ? (normal.x > 0.0f ? 0 : 1) :
                                                normal.y != 0 ? (normal.y > 0.0f ? 2 : 3) :
                                                (normal.z > 0.0f ? 4 : 5);
                        *(uint32_t*)&normal.x = normal_index;
                    }
                    // cache this mesh so we don't need to do it multiple times.
                    meshes[model_index] = mesh;
                }

                // some instances can have no geometry, so we just skip em
                const ogt_mesh* mesh = meshes[model_index];
                if (!mesh)
                    continue;

                if (voxel_scale != 1.0f) {
                    // bake voxel scale into the transform to avoid doing the scale per vertex.
                    float* transform_data = &transform.m00;
                    for (size_t i = 0; i < 16; i++) {
                        transform_data[i] *= voxel_scale;
                    }
                    // scaling vertex positions, so we do floating point writes
                    for (size_t i = 0; i < mesh->vertex_count; i++) {
                        ogt_mesh_vec3 pos = transform_point(transform, mesh->vertices[i].pos);
                        fprintf(fout, "v %f %f %f\n", pos.x, pos.y, pos.z);
                    }
                }
                else {
                    // we're not scaling positions, can write them much more compactly (smaller .obj file size) as int.
                    for (size_t i = 0; i < mesh->vertex_count; i++) {
                        ogt_mesh_vec3 pos = transform_point(transform, mesh->vertices[i].pos);
                        fprintf(fout, "v %i %i %i\n", (int32_t)pos.x, (int32_t)pos.y, (int32_t)pos.z);
                    }
                }
                // write faces
                for (size_t i = 0; i < mesh->index_count; i += 3) {
                    uint32_t v_i0 = base_vertex_index + mesh->indices[i + 0] + 1;
                    uint32_t v_i1 = base_vertex_index + mesh->indices[i + 1] + 1;
                    uint32_t v_i2 = base_vertex_index + mesh->indices[i + 2] + 1;
                    uint32_t t_i0 = mesh->vertices[mesh->indices[i+0]].color.a + 1;
                    uint32_t t_i1 = mesh->vertices[mesh->indices[i+1]].color.a + 1;
                    uint32_t t_i2 = mesh->vertices[mesh->indices[i+2]].color.a + 1;
                    uint32_t n_i0 = *((uint32_t*)&mesh->vertices[mesh->indices[i+0]].normal.x) + 1;
                    uint32_t n_i1 = *((uint32_t*)&mesh->vertices[mesh->indices[i+1]].normal.x) + 1;
                    uint32_t n_i2 = *((uint32_t*)&mesh->vertices[mesh->indices[i+2]].normal.x) + 1;
                    fprintf(fout, "f %u/%u/%u %u/%u/%u %u/%u/%u\n", v_i0, t_i0, n_i0, v_i1, t_i1, n_i1, v_i2, t_i2, n_i2);
                }
                base_vertex_index += mesh->vertex_count;
            }
        }

        if (fout) {
            fclose(fout);
        }
    }
    return !error;
}